

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O2

tchar prvTidyCombineSurrogatePair(tchar high,tchar low)

{
  if (((high & 0xfffffc00) == 0xdc00) && ((low & 0xfffffc00) == 0xd800)) {
    return high + low * 0x400 + 0xfca02400;
  }
  __assert_fail("TY_(IsHighSurrogate)(high) && TY_(IsLowSurrogate)(low)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/utf8.c"
                ,0x1e7,"tchar prvTidyCombineSurrogatePair(tchar, tchar)");
}

Assistant:

tchar   TY_(CombineSurrogatePair)( tchar high, tchar low )
{
    assert( TY_(IsHighSurrogate)(high) && TY_(IsLowSurrogate)(low) );
    return ( ((low - kUTF16LowSurrogateBegin) * 0x400) + 
             high - kUTF16HighSurrogateBegin + 0x10000 );
}